

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkCheckConstant_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int RetValue;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjFaninNum(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 == 0) {
      pObj_local._4_4_ = -1;
    }
    else {
      iVar1 = Abc_NodeIsConst0(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_NodeIsConst1(pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                        ,0x30a,"int Abc_NtkCheckConstant_rec(Abc_Obj_t *)");
        }
        pObj_local._4_4_ = 1;
      }
      else {
        pObj_local._4_4_ = 0;
      }
    }
  }
  else {
    iVar1 = Abc_ObjIsLatch(pObj);
    if ((iVar1 == 0) && (iVar1 = Abc_ObjFaninNum(pObj), iVar1 < 2)) {
      iVar1 = Abc_ObjIsNode(pObj);
      if ((iVar1 == 0) || (iVar1 = Abc_NodeIsBuf(pObj), iVar1 != 0)) {
        pAVar2 = Abc_ObjFanin0(pObj);
        pObj_local._4_4_ = Abc_NtkCheckConstant_rec(pAVar2);
      }
      else {
        iVar1 = Abc_NodeIsInv(pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                        ,0x31a,"int Abc_NtkCheckConstant_rec(Abc_Obj_t *)");
        }
        pAVar2 = Abc_ObjFanin0(pObj);
        pObj_local._4_4_ = Abc_NtkCheckConstant_rec(pAVar2);
        if (pObj_local._4_4_ == 0) {
          pObj_local._4_4_ = 1;
        }
        else if (pObj_local._4_4_ == 1) {
          pObj_local._4_4_ = 0;
        }
      }
    }
    else {
      pObj_local._4_4_ = -1;
    }
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkCheckConstant_rec( Abc_Obj_t * pObj )
{
    if ( Abc_ObjFaninNum(pObj) == 0 )
    {
        if ( !Abc_ObjIsNode(pObj) )
            return -1;
        if ( Abc_NodeIsConst0(pObj) )
            return 0;
        if ( Abc_NodeIsConst1(pObj) )
            return 1;
        assert( 0 );
        return -1;
    }
    if ( Abc_ObjIsLatch(pObj) || Abc_ObjFaninNum(pObj) > 1 )
        return -1;
    if ( !Abc_ObjIsNode(pObj) || Abc_NodeIsBuf(pObj) )
        return Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pObj) );
    if ( Abc_NodeIsInv(pObj) )
    {
        int RetValue = Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pObj) );
        if ( RetValue == 0 )
            return 1;
        if ( RetValue == 1 )
            return 0;
        return RetValue;
    }
    assert( 0 );
    return -1;
}